

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t * container_unwrap_shared(container_t *candidate_shared_container,uint8_t *type)

{
  uint8_t *type_local;
  container_t *candidate_shared_container_local;
  container_t *local_8;
  
  local_8 = candidate_shared_container;
  if (*type == '\x04') {
    *type = *(uint8_t *)((long)candidate_shared_container + 8);
    local_8 = *candidate_shared_container;
  }
  return local_8;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}